

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
cleanAll(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
         *this)

{
  int iVar1;
  int iVar2;
  Lit *pLVar3;
  char *pcVar4;
  long in_RDI;
  Lit *in_stack_00000018;
  int i;
  vec<char> *in_stack_ffffffffffffffd8;
  undefined1 dealloc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_c;
  
  local_c = 0;
  while( true ) {
    dealloc = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    iVar2 = local_c;
    iVar1 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x20));
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffd8 = (vec<char> *)(in_RDI + 0x10);
    pLVar3 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)(in_RDI + 0x20),local_c);
    iVar2 = toInt((Lit)pLVar3->x);
    pcVar4 = vec<char>::operator[](in_stack_ffffffffffffffd8,iVar2);
    if (*pcVar4 != '\0') {
      vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)(in_RDI + 0x20),local_c);
      clean(this,in_stack_00000018);
    }
    local_c = local_c + 1;
  }
  vec<Glucose::Lit>::clear
            ((vec<Glucose::Lit> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(bool)dealloc);
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])])
            clean(dirties[i]);
    dirties.clear();
}